

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

void __thiscall QSpanCollection::clear(QSpanCollection *this)

{
  qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
            (&this->spans);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
  std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::clear
            (&this->spans);
  return;
}

Assistant:

void QSpanCollection::clear()
{
    qDeleteAll(spans);
    index.clear();
    spans.clear();
}